

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O2

int t1_init_ctxno_sc(int f)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = (uint)((f & 0x440U) == 0x40 || (f & 0x110U) == 0x10) -
          (uint)((f & 0x440U) == 0x440 || (f & 0x110U) == 0x110);
  uVar1 = (uint)((f & 0x880U) == 0x80 || (f & 0x220U) == 0x20);
  uVar3 = (uint)((f & 0x880U) == 0x880 || (f & 0x220U) == 0x220);
  if (uVar1 != uVar3) {
    iVar4 = -iVar2;
    if (-1 < (int)(uVar1 - uVar3)) {
      iVar4 = iVar2;
    }
    iVar2 = 0xb;
    if (iVar4 != -1) {
      iVar2 = 0xd - (uint)(iVar4 == 0);
    }
    return iVar2;
  }
  return 10 - (uint)(iVar2 == 0);
}

Assistant:

static int t1_init_ctxno_sc(int f) {
	int hc, vc, n;
	n = 0;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (hc < 0) {
		hc = -hc;
		vc = -vc;
	}
	if (!hc) {
		if (vc == -1)
			n = 1;
		else if (!vc)
			n = 0;
		else
			n = 1;
	} else if (hc == 1) {
		if (vc == -1)
			n = 2;
		else if (!vc)
			n = 3;
		else
			n = 4;
	}

	return (T1_CTXNO_SC + n);
}